

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmap.cpp
# Opt level: O0

uint32_t anon_unknown.dwarf_349e729::DecodeBits
                   (const_iterator *bitpos,const_iterator *endpos,uint8_t minval,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *bit_sizes)

{
  long lVar1;
  bool bVar2;
  const_reference cVar3;
  byte *pbVar4;
  reference puVar5;
  byte in_DL;
  long in_FS_OFFSET;
  int b;
  bool bit;
  uint32_t val;
  const_iterator bit_sizes_it;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int iVar6;
  int iVar7;
  uint in_stack_ffffffffffffff88;
  byte bVar8;
  uint local_4c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = (uint)in_DL;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  while( true ) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    bVar2 = __gnu_cxx::
            operator==<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)CONCAT44(local_4c,in_stack_ffffffffffffff88),
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)CONCAT44(local_4c,in_stack_ffffffffffffff88),
                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    bVar2 = __gnu_cxx::
            operator==<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)CONCAT44(local_4c,in_stack_ffffffffffffff88),
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 & 0xffffff;
    }
    else {
      bVar2 = std::operator==((_Bit_iterator_base *)CONCAT44(local_4c,in_stack_ffffffffffffff88),
                              (_Bit_iterator_base *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      if (bVar2) break;
      cVar3 = std::_Bit_const_iterator::operator*
                        ((_Bit_const_iterator *)CONCAT44(local_4c,in_stack_ffffffffffffff88));
      in_stack_ffffffffffffff88 = CONCAT13(cVar3,(int3)in_stack_ffffffffffffff88);
      std::_Bit_const_iterator::operator++
                ((_Bit_const_iterator *)CONCAT44(local_4c,in_stack_ffffffffffffff88),
                 in_stack_ffffffffffffff84);
    }
    if ((in_stack_ffffffffffffff88 & 0x1000000) == 0) {
      iVar6 = 0;
      goto LAB_01ab3fde;
    }
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_4c = (1 << (*pbVar4 & 0x1f)) + local_4c;
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  local_4c = 0xffffffff;
LAB_01ab40ae:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_4c;
LAB_01ab3fde:
  iVar7 = iVar6;
  pbVar4 = __gnu_cxx::
           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if ((int)(uint)*pbVar4 <= iVar6) goto LAB_01ab40ae;
  bVar2 = std::operator==((_Bit_iterator_base *)CONCAT44(local_4c,in_stack_ffffffffffffff88),
                          (_Bit_iterator_base *)CONCAT44(iVar7,iVar6));
  if (bVar2) {
    local_4c = 0xffffffff;
    goto LAB_01ab40ae;
  }
  cVar3 = std::_Bit_const_iterator::operator*
                    ((_Bit_const_iterator *)CONCAT44(local_4c,in_stack_ffffffffffffff88));
  in_stack_ffffffffffffff88 = CONCAT13(cVar3,(int3)in_stack_ffffffffffffff88);
  std::_Bit_const_iterator::operator++
            ((_Bit_const_iterator *)CONCAT44(local_4c,in_stack_ffffffffffffff88),iVar7);
  bVar8 = (byte)(in_stack_ffffffffffffff88 >> 0x18);
  in_stack_ffffffffffffff7c = (uint)(bVar8 & 1);
  puVar5 = __gnu_cxx::
           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)(ulong)(CONCAT14(bVar8,in_stack_ffffffffffffff78) & 0x1ffffffff));
  local_4c = (in_stack_ffffffffffffff7c << ((*puVar5 + 0xff) - (char)iVar7 & 0x1f)) + local_4c;
  iVar6 = iVar7 + 1;
  goto LAB_01ab3fde;
}

Assistant:

uint32_t DecodeBits(std::vector<bool>::const_iterator& bitpos, const std::vector<bool>::const_iterator& endpos, uint8_t minval, const std::vector<uint8_t> &bit_sizes)
{
    uint32_t val = minval;
    bool bit;
    for (std::vector<uint8_t>::const_iterator bit_sizes_it = bit_sizes.begin();
        bit_sizes_it != bit_sizes.end(); ++bit_sizes_it) {
        if (bit_sizes_it + 1 != bit_sizes.end()) {
            if (bitpos == endpos) break;
            bit = *bitpos;
            bitpos++;
        } else {
            bit = 0;
        }
        if (bit) {
            val += (1 << *bit_sizes_it);
        } else {
            for (int b = 0; b < *bit_sizes_it; b++) {
                if (bitpos == endpos) return INVALID; // Reached EOF in mantissa
                bit = *bitpos;
                bitpos++;
                val += bit << (*bit_sizes_it - 1 - b);
            }
            return val;
        }
    }
    return INVALID; // Reached EOF in exponent
}